

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  vfloat<4> vVar3;
  byte bVar4;
  BVH *bvh;
  void *pvVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  vbool<4> vVar21;
  char cVar22;
  bool bVar23;
  uint uVar24;
  undefined4 uVar25;
  int iVar26;
  AABBNodeMB4D *node1;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  NodeRef root;
  size_t sVar30;
  ulong uVar31;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar32;
  NodeRef *pNVar33;
  float fVar34;
  vint4 bi_10;
  undefined1 auVar35 [16];
  float fVar39;
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  undefined1 in_ZMM0 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  vint4 bi_13;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  vint4 ai;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  vint4 ai_2;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  vint4 ai_1;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  vint4 ai_3;
  float fVar77;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  vint4 bi;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  vint4 bi_1;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  vfloat4 a0;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  vint4 bi_2;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [64];
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined1 local_1958 [8];
  float fStack_1950;
  float fStack_194c;
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_false> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar20 = mm_lookupmask_ps._8_8_;
  uVar19 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar30 = (bvh->root).ptr;
  if (sVar30 != 8) {
    auVar48 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar47 = vpcmpeqd_avx(auVar48,(undefined1  [16])valid_i->field_0);
    auVar48 = *(undefined1 (*) [16])(ray + 0x80);
    auVar40 = ZEXT816(0) << 0x40;
    auVar42 = vcmpps_avx(auVar48,auVar40,5);
    auVar42 = vandps_avx(auVar42,auVar47);
    uVar27 = vmovmskps_avx(auVar42);
    if (uVar27 != 0) {
      uVar28 = (ulong)(uVar27 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar47._0_4_ = tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_;
      auVar47._4_4_ = tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_;
      auVar47._8_4_ = tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_;
      auVar47._12_4_ = tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_;
      auVar47 = vfmadd231ps_fma(auVar47,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar65 = vfmadd231ps_fma(auVar47,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar47 = vrsqrtps_avx(auVar65);
      fVar34 = auVar47._0_4_;
      fVar37 = auVar47._4_4_;
      fVar38 = auVar47._8_4_;
      fVar77 = auVar47._12_4_;
      auVar64._0_4_ = fVar34 * fVar34 * fVar34 * auVar65._0_4_ * -0.5;
      auVar64._4_4_ = fVar37 * fVar37 * fVar37 * auVar65._4_4_ * -0.5;
      auVar64._8_4_ = fVar38 * fVar38 * fVar38 * auVar65._8_4_ * -0.5;
      auVar64._12_4_ = fVar77 * fVar77 * fVar77 * auVar65._12_4_ * -0.5;
      auVar78._8_4_ = 0x3fc00000;
      auVar78._0_8_ = 0x3fc000003fc00000;
      auVar78._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vfmadd213ps_fma(auVar78,auVar47,auVar64);
      auVar65._8_4_ = 0x80000000;
      auVar65._0_8_ = 0x8000000080000000;
      auVar65._12_4_ = 0x80000000;
      do {
        lVar29 = 0;
        for (uVar31 = uVar28; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
          lVar29 = lVar29 + 1;
        }
        uVar31 = (ulong)(uint)((int)lVar29 * 4);
        auVar47 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar31 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar31 + 0x50)),0x1c);
        auVar47 = vinsertps_avx(auVar47,ZEXT416(*(uint *)(ray + uVar31 + 0x60)),0x28);
        fVar34 = *(float *)((long)pre.ray_space + (uVar31 - 0x10));
        auVar88._0_4_ = auVar47._0_4_ * fVar34;
        auVar88._4_4_ = auVar47._4_4_ * fVar34;
        auVar88._8_4_ = auVar47._8_4_ * fVar34;
        auVar88._12_4_ = auVar47._12_4_ * fVar34;
        auVar64 = vshufpd_avx(auVar88,auVar88,1);
        auVar47 = vmovshdup_avx(auVar88);
        auVar97._0_4_ = auVar47._0_4_ ^ 0x80000000;
        auVar47 = vunpckhps_avx(auVar88,auVar40);
        auVar97._4_12_ = ZEXT812(0) << 0x20;
        auVar92._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
        auVar92._8_8_ = auVar64._8_8_ ^ auVar65._8_8_;
        auVar78 = vinsertps_avx(auVar92,auVar88,0x2a);
        auVar82 = vshufps_avx(auVar47,auVar97,0x41);
        auVar47 = vdpps_avx(auVar78,auVar78,0x7f);
        auVar64 = vdpps_avx(auVar82,auVar82,0x7f);
        auVar47 = vcmpps_avx(auVar47,auVar64,1);
        auVar101._0_4_ = auVar47._0_4_;
        auVar101._4_4_ = auVar101._0_4_;
        auVar101._8_4_ = auVar101._0_4_;
        auVar101._12_4_ = auVar101._0_4_;
        auVar47 = vblendvps_avx(auVar78,auVar82,auVar101);
        auVar64 = vdpps_avx(auVar47,auVar47,0x7f);
        auVar78 = vrsqrtss_avx(auVar64,auVar64);
        fVar37 = auVar78._0_4_;
        fVar37 = fVar37 * 1.5 - auVar64._0_4_ * 0.5 * fVar37 * fVar37 * fVar37;
        auVar93._0_4_ = auVar47._0_4_ * fVar37;
        auVar93._4_4_ = auVar47._4_4_ * fVar37;
        auVar93._8_4_ = auVar47._8_4_ * fVar37;
        auVar93._12_4_ = auVar47._12_4_ * fVar37;
        auVar47 = vshufps_avx(auVar93,auVar93,0xc9);
        auVar64 = vshufps_avx(auVar88,auVar88,0xc9);
        auVar102._0_4_ = auVar93._0_4_ * auVar64._0_4_;
        auVar102._4_4_ = auVar93._4_4_ * auVar64._4_4_;
        auVar102._8_4_ = auVar93._8_4_ * auVar64._8_4_;
        auVar102._12_4_ = auVar93._12_4_ * auVar64._12_4_;
        auVar47 = vfmsub231ps_fma(auVar102,auVar88,auVar47);
        auVar78 = vshufps_avx(auVar47,auVar47,0xc9);
        auVar47 = vdpps_avx(auVar78,auVar78,0x7f);
        auVar64 = vrsqrtss_avx(auVar47,auVar47);
        fVar37 = auVar64._0_4_;
        fVar37 = fVar37 * 1.5 - auVar47._0_4_ * 0.5 * fVar37 * fVar37 * fVar37;
        uVar28 = uVar28 - 1 & uVar28;
        auVar98._0_4_ = fVar37 * auVar78._0_4_;
        auVar98._4_4_ = fVar37 * auVar78._4_4_;
        auVar98._8_4_ = fVar37 * auVar78._8_4_;
        auVar98._12_4_ = fVar37 * auVar78._12_4_;
        auVar82._0_4_ = fVar34 * auVar88._0_4_;
        auVar82._4_4_ = fVar34 * auVar88._4_4_;
        auVar82._8_4_ = fVar34 * auVar88._8_4_;
        auVar82._12_4_ = fVar34 * auVar88._12_4_;
        auVar78 = vunpcklps_avx(auVar93,auVar82);
        auVar47 = vunpckhps_avx(auVar93,auVar82);
        auVar82 = vunpcklps_avx(auVar98,auVar40);
        auVar64 = vunpckhps_avx(auVar98,auVar40);
        aVar11 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar47,auVar64);
        aVar12 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar78,auVar82);
        aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar78,auVar82);
        pre.ray_space[lVar29].vx.field_0 = aVar12;
        pre.ray_space[lVar29].vy.field_0 = aVar10;
        pre.ray_space[lVar29].vz.field_0 = aVar11;
      } while (uVar28 != 0);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      auVar83._8_4_ = 0x7fffffff;
      auVar83._0_8_ = 0x7fffffff7fffffff;
      auVar83._12_4_ = 0x7fffffff;
      auVar47 = vandps_avx(auVar83,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar89._8_4_ = 0x219392ef;
      auVar89._0_8_ = 0x219392ef219392ef;
      auVar89._12_4_ = 0x219392ef;
      auVar47 = vcmpps_avx(auVar47,auVar89,1);
      auVar40 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar89,auVar47);
      auVar47 = vandps_avx(auVar83,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar47 = vcmpps_avx(auVar47,auVar89,1);
      auVar65 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar89,auVar47);
      auVar47 = vandps_avx(auVar83,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar47 = vcmpps_avx(auVar47,auVar89,1);
      auVar47 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar89,auVar47);
      auVar64 = vrcpps_avx(auVar40);
      auVar84._8_4_ = 0x3f800000;
      auVar84._0_8_ = 0x3f8000003f800000;
      auVar84._12_4_ = 0x3f800000;
      auVar40 = vfnmadd213ps_fma(auVar40,auVar64,auVar84);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar40,auVar64,auVar64)
      ;
      auVar40 = vrcpps_avx(auVar65);
      auVar65 = vfnmadd213ps_fma(auVar65,auVar40,auVar84);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar65,auVar40,auVar40)
      ;
      auVar40 = vrcpps_avx(auVar47);
      auVar47 = vfnmadd213ps_fma(auVar47,auVar40,auVar84);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar47,auVar40,auVar40)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      auVar40 = ZEXT416(0) << 0x20;
      auVar47 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar40,1);
      auVar55._8_4_ = 0x10;
      auVar55._0_8_ = 0x1000000010;
      auVar55._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar47,auVar55);
      auVar47 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar40,5);
      auVar56._8_4_ = 0x20;
      auVar56._0_8_ = 0x2000000020;
      auVar56._12_4_ = 0x20;
      auVar66._8_4_ = 0x30;
      auVar66._0_8_ = 0x3000000030;
      auVar66._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar66,auVar56,auVar47);
      auVar47 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar40,5);
      auVar44._8_4_ = 0x40;
      auVar44._0_8_ = 0x4000000040;
      auVar44._12_4_ = 0x40;
      auVar51._8_4_ = 0x50;
      auVar51._0_8_ = 0x5000000050;
      auVar51._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar51,auVar44,auVar47);
      auVar47 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar40);
      auVar48 = vmaxps_avx(auVar48,auVar40);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar107 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar47,auVar42);
      auVar40._8_4_ = 0xff800000;
      auVar40._0_8_ = 0xff800000ff800000;
      auVar40._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar40,auVar48,auVar42);
      auVar48 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0
                            );
      terminated.field_0._0_4_ = auVar42._0_4_ ^ auVar48._0_4_;
      terminated.field_0._4_4_ = auVar42._4_4_ ^ auVar48._4_4_;
      terminated.field_0._8_4_ = auVar42._8_4_ ^ auVar48._8_4_;
      terminated.field_0._12_4_ = auVar42._12_4_ ^ auVar48._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar27 = 3;
      }
      else {
        uVar27 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar33 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar32 = &stack_near[2].field_0;
      stack_node[1].ptr = sVar30;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_004e6510:
      do {
        do {
          root.ptr = pNVar33[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_004e6c07;
          pNVar33 = pNVar33 + -1;
          paVar32 = paVar32 + -1;
          vVar3.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar32->v;
          auVar50 = ZEXT1664((undefined1  [16])vVar3.field_0);
          auVar48 = vcmpps_avx((undefined1  [16])vVar3.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar24 = vmovmskps_avx(auVar48);
        } while (uVar24 == 0);
        uVar28 = (ulong)(uVar24 & 0xff);
        uVar24 = POPCOUNT(uVar24 & 0xff);
        if (uVar27 < uVar24) {
LAB_004e654e:
          do {
            vVar21.field_0 = terminated.field_0;
            iVar26 = 4;
            lVar29 = -0x10;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_004e6c07;
              auVar48 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar50._0_16_,6);
              if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar48[0xf] < '\0') {
                bVar4 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar5 = This->leafIntersector;
                valid_o.field_0._8_8_ = uVar20;
                valid_o.field_0._0_8_ = uVar19;
                uVar24 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                if ((uVar24 ^ 0xf) != 0) {
                  uVar28 = (ulong)((uVar24 ^ 0xf) & 0xff);
                  do {
                    lVar29 = 0;
                    for (uVar31 = uVar28; (uVar31 & 1) == 0;
                        uVar31 = uVar31 >> 1 | 0x8000000000000000) {
                      lVar29 = lVar29 + 1;
                    }
                    cVar22 = (**(code **)((long)pvVar5 + (ulong)bVar4 * 0x40 + 0x18))
                                       (&pre,ray,lVar29,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    if (cVar22 != '\0') {
                      valid_o.field_0.i[lVar29] = -1;
                    }
                    uVar28 = uVar28 - 1 & uVar28;
                  } while (uVar28 != 0);
                  auVar107 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vorps_avx((undefined1  [16])valid_o.field_0,(undefined1  [16])vVar21.field_0);
                auVar48 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar48 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar48 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar48[0xf]) goto LAB_004e6c07;
                auVar49._8_4_ = 0xff800000;
                auVar49._0_8_ = 0xff800000ff800000;
                auVar49._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar49,
                                   (undefined1  [16])terminated.field_0);
              }
              goto LAB_004e6510;
            }
            uVar28 = root.ptr & 0xfffffffffffffff0;
            uVar24 = (uint)root.ptr & 7;
            auVar48 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar50._0_16_,6);
            auVar43 = ZEXT1664(auVar48);
            auVar48 = auVar107._0_16_;
            sVar30 = 8;
            do {
              root.ptr = *(size_t *)(uVar28 + 0x20 + lVar29 * 2);
              if (root.ptr == 8) {
                auVar50 = ZEXT1664(auVar48);
                root.ptr = sVar30;
                break;
              }
              if ((uVar24 == 6) || (uVar24 == 1)) {
                uVar25 = *(undefined4 *)(uVar28 + 0x90 + lVar29);
                auVar57._4_4_ = uVar25;
                auVar57._0_4_ = uVar25;
                auVar57._8_4_ = uVar25;
                auVar57._12_4_ = uVar25;
                uVar25 = *(undefined4 *)(uVar28 + 0x30 + lVar29);
                auVar52._4_4_ = uVar25;
                auVar52._0_4_ = uVar25;
                auVar52._8_4_ = uVar25;
                auVar52._12_4_ = uVar25;
                auVar47 = *(undefined1 (*) [16])(ray + 0x70);
                auVar40 = vfmadd231ps_fma(auVar52,auVar47,auVar57);
                uVar25 = *(undefined4 *)(uVar28 + 0xb0 + lVar29);
                auVar58._4_4_ = uVar25;
                auVar58._0_4_ = uVar25;
                auVar58._8_4_ = uVar25;
                auVar58._12_4_ = uVar25;
                uVar25 = *(undefined4 *)(uVar28 + 0x50 + lVar29);
                auVar67._4_4_ = uVar25;
                auVar67._0_4_ = uVar25;
                auVar67._8_4_ = uVar25;
                auVar67._12_4_ = uVar25;
                auVar65 = vfmadd231ps_fma(auVar67,auVar47,auVar58);
                uVar25 = *(undefined4 *)(uVar28 + 0xd0 + lVar29);
                auVar59._4_4_ = uVar25;
                auVar59._0_4_ = uVar25;
                auVar59._8_4_ = uVar25;
                auVar59._12_4_ = uVar25;
                uVar25 = *(undefined4 *)(uVar28 + 0x70 + lVar29);
                auVar72._4_4_ = uVar25;
                auVar72._0_4_ = uVar25;
                auVar72._8_4_ = uVar25;
                auVar72._12_4_ = uVar25;
                auVar64 = vfmadd231ps_fma(auVar72,auVar47,auVar59);
                uVar25 = *(undefined4 *)(uVar28 + 0xa0 + lVar29);
                auVar60._4_4_ = uVar25;
                auVar60._0_4_ = uVar25;
                auVar60._8_4_ = uVar25;
                auVar60._12_4_ = uVar25;
                uVar25 = *(undefined4 *)(uVar28 + 0x40 + lVar29);
                auVar79._4_4_ = uVar25;
                auVar79._0_4_ = uVar25;
                auVar79._8_4_ = uVar25;
                auVar79._12_4_ = uVar25;
                auVar78 = vfmadd231ps_fma(auVar79,auVar47,auVar60);
                uVar25 = *(undefined4 *)(uVar28 + 0xc0 + lVar29);
                auVar61._4_4_ = uVar25;
                auVar61._0_4_ = uVar25;
                auVar61._8_4_ = uVar25;
                auVar61._12_4_ = uVar25;
                uVar25 = *(undefined4 *)(uVar28 + 0x60 + lVar29);
                auVar85._4_4_ = uVar25;
                auVar85._0_4_ = uVar25;
                auVar85._8_4_ = uVar25;
                auVar85._12_4_ = uVar25;
                auVar82 = vfmadd231ps_fma(auVar85,auVar47,auVar61);
                uVar25 = *(undefined4 *)(uVar28 + 0xe0 + lVar29);
                auVar62._4_4_ = uVar25;
                auVar62._0_4_ = uVar25;
                auVar62._8_4_ = uVar25;
                auVar62._12_4_ = uVar25;
                uVar25 = *(undefined4 *)(uVar28 + 0x80 + lVar29);
                auVar90._4_4_ = uVar25;
                auVar90._0_4_ = uVar25;
                auVar90._8_4_ = uVar25;
                auVar90._12_4_ = uVar25;
                auVar88 = vfmadd231ps_fma(auVar90,auVar47,auVar62);
                auVar16._4_4_ = tray.org_rdir.field_0._4_4_;
                auVar16._0_4_ = tray.org_rdir.field_0._0_4_;
                auVar16._8_4_ = tray.org_rdir.field_0._8_4_;
                auVar16._12_4_ = tray.org_rdir.field_0._12_4_;
                auVar92 = vfmsub213ps_fma(auVar40,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar16);
                auVar17._4_4_ = tray.org_rdir.field_0._20_4_;
                auVar17._0_4_ = tray.org_rdir.field_0._16_4_;
                auVar17._8_4_ = tray.org_rdir.field_0._24_4_;
                auVar17._12_4_ = tray.org_rdir.field_0._28_4_;
                auVar93 = vfmsub213ps_fma(auVar65,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar17);
                auVar18._4_4_ = tray.org_rdir.field_0._36_4_;
                auVar18._0_4_ = tray.org_rdir.field_0._32_4_;
                auVar18._8_4_ = tray.org_rdir.field_0._40_4_;
                auVar18._12_4_ = tray.org_rdir.field_0._44_4_;
                auVar97 = vfmsub213ps_fma(auVar64,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar18);
                auVar64 = vfmsub213ps_fma(auVar78,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar16);
                auVar78 = vfmsub213ps_fma(auVar82,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar17);
                auVar82 = vfmsub213ps_fma(auVar88,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar18);
                auVar40 = vpminsd_avx(auVar92,auVar64);
                auVar65 = vpminsd_avx(auVar93,auVar78);
                auVar40 = vpmaxsd_avx(auVar40,auVar65);
                auVar65 = vpminsd_avx(auVar97,auVar82);
                auVar40 = vpmaxsd_avx(auVar40,auVar65);
                auVar65 = vpmaxsd_avx(auVar92,auVar64);
                auVar64 = vpmaxsd_avx(auVar93,auVar78);
                auVar78 = vpminsd_avx(auVar65,auVar64);
                auVar65 = vpmaxsd_avx(auVar97,auVar82);
                auVar64 = vpmaxsd_avx(auVar40,(undefined1  [16])tray.tnear.field_0);
                auVar65 = vpminsd_avx(auVar78,auVar65);
                auVar65 = vpminsd_avx(auVar65,(undefined1  [16])tray.tfar.field_0);
                if (uVar24 == 6) {
                  auVar65 = vcmpps_avx(auVar64,auVar65,2);
                  uVar25 = *(undefined4 *)(uVar28 + 0xf0 + lVar29);
                  auVar71._4_4_ = uVar25;
                  auVar71._0_4_ = uVar25;
                  auVar71._8_4_ = uVar25;
                  auVar71._12_4_ = uVar25;
                  auVar64 = vcmpps_avx(auVar71,auVar47,2);
                  uVar25 = *(undefined4 *)(uVar28 + 0x100 + lVar29);
                  auVar76._4_4_ = uVar25;
                  auVar76._0_4_ = uVar25;
                  auVar76._8_4_ = uVar25;
                  auVar76._12_4_ = uVar25;
                  auVar47 = vcmpps_avx(auVar47,auVar76,1);
                  auVar47 = vandps_avx(auVar64,auVar47);
                  auVar47 = vandps_avx(auVar47,auVar65);
                }
                else {
                  auVar47 = vcmpps_avx(auVar64,auVar65,2);
                }
              }
              else {
                uVar25 = *(undefined4 *)(uVar28 + 0x30 + lVar29);
                auVar80._4_4_ = uVar25;
                auVar80._0_4_ = uVar25;
                auVar80._8_4_ = uVar25;
                auVar80._12_4_ = uVar25;
                uVar25 = *(undefined4 *)(uVar28 + 0x40 + lVar29);
                auVar73._4_4_ = uVar25;
                auVar73._0_4_ = uVar25;
                auVar73._8_4_ = uVar25;
                auVar73._12_4_ = uVar25;
                uVar25 = *(undefined4 *)(uVar28 + 0x50 + lVar29);
                auVar68._4_4_ = uVar25;
                auVar68._0_4_ = uVar25;
                auVar68._8_4_ = uVar25;
                auVar68._12_4_ = uVar25;
                uVar25 = *(undefined4 *)(uVar28 + 0x60 + lVar29);
                auVar94._4_4_ = uVar25;
                auVar94._0_4_ = uVar25;
                auVar94._8_4_ = uVar25;
                auVar94._12_4_ = uVar25;
                uVar25 = *(undefined4 *)(uVar28 + 0x70 + lVar29);
                auVar91._4_4_ = uVar25;
                auVar91._0_4_ = uVar25;
                auVar91._8_4_ = uVar25;
                auVar91._12_4_ = uVar25;
                uVar25 = *(undefined4 *)(uVar28 + 0x80 + lVar29);
                auVar86._4_4_ = uVar25;
                auVar86._0_4_ = uVar25;
                auVar86._8_4_ = uVar25;
                auVar86._12_4_ = uVar25;
                fVar34 = *(float *)(uVar28 + 0x90 + lVar29);
                auVar99._4_4_ = fVar34;
                auVar99._0_4_ = fVar34;
                auVar99._8_4_ = fVar34;
                auVar99._12_4_ = fVar34;
                fVar37 = *(float *)(uVar28 + 0xa0 + lVar29);
                auVar103._4_4_ = fVar37;
                auVar103._0_4_ = fVar37;
                auVar103._8_4_ = fVar37;
                auVar103._12_4_ = fVar37;
                fVar38 = *(float *)(uVar28 + 0xb0 + lVar29);
                auVar105._4_4_ = fVar38;
                auVar105._0_4_ = fVar38;
                auVar105._8_4_ = fVar38;
                auVar105._12_4_ = fVar38;
                uVar25 = *(undefined4 *)(uVar28 + 0xc0 + lVar29);
                auVar63._4_4_ = uVar25;
                auVar63._0_4_ = uVar25;
                auVar63._8_4_ = uVar25;
                auVar63._12_4_ = uVar25;
                uVar25 = *(undefined4 *)(uVar28 + 0xd0 + lVar29);
                auVar53._4_4_ = uVar25;
                auVar53._0_4_ = uVar25;
                auVar53._8_4_ = uVar25;
                auVar53._12_4_ = uVar25;
                uVar25 = *(undefined4 *)(uVar28 + 0xe0 + lVar29);
                auVar35._4_4_ = uVar25;
                auVar35._0_4_ = uVar25;
                auVar35._8_4_ = uVar25;
                auVar35._12_4_ = uVar25;
                auVar15._4_4_ = tray.org.field_0._36_4_;
                auVar15._0_4_ = tray.org.field_0._32_4_;
                auVar15._8_4_ = tray.org.field_0._40_4_;
                auVar15._12_4_ = tray.org.field_0._44_4_;
                auVar47 = vfmadd231ps_fma(auVar63,auVar15,auVar99);
                auVar40 = vfmadd231ps_fma(auVar53,auVar15,auVar103);
                auVar65 = vfmadd231ps_fma(auVar35,auVar15,auVar105);
                auVar106._0_4_ = fVar34 * (float)tray.dir.field_0._32_4_;
                auVar106._4_4_ = fVar34 * (float)tray.dir.field_0._36_4_;
                auVar106._8_4_ = fVar34 * (float)tray.dir.field_0._40_4_;
                auVar106._12_4_ = fVar34 * (float)tray.dir.field_0._44_4_;
                auVar104._0_4_ = fVar37 * (float)tray.dir.field_0._32_4_;
                auVar104._4_4_ = fVar37 * (float)tray.dir.field_0._36_4_;
                auVar104._8_4_ = fVar37 * (float)tray.dir.field_0._40_4_;
                auVar104._12_4_ = fVar37 * (float)tray.dir.field_0._44_4_;
                auVar100._0_4_ = fVar38 * (float)tray.dir.field_0._32_4_;
                auVar100._4_4_ = fVar38 * (float)tray.dir.field_0._36_4_;
                auVar100._8_4_ = fVar38 * (float)tray.dir.field_0._40_4_;
                auVar100._12_4_ = fVar38 * (float)tray.dir.field_0._44_4_;
                auVar64 = vfmadd231ps_fma(auVar106,(undefined1  [16])
                                                   tray.dir.field_0.field_0.y.field_0,auVar94);
                auVar78 = vfmadd231ps_fma(auVar104,(undefined1  [16])
                                                   tray.dir.field_0.field_0.y.field_0,auVar91);
                auVar82 = vfmadd231ps_fma(auVar100,auVar86,
                                          (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
                auVar14._4_4_ = tray.org.field_0._20_4_;
                auVar14._0_4_ = tray.org.field_0._16_4_;
                auVar14._8_4_ = tray.org.field_0._24_4_;
                auVar14._12_4_ = tray.org.field_0._28_4_;
                auVar47 = vfmadd231ps_fma(auVar47,auVar14,auVar94);
                fVar34 = *(float *)(uVar28 + 0xf0 + lVar29);
                auVar40 = vfmadd231ps_fma(auVar40,auVar14,auVar91);
                fVar37 = *(float *)(uVar28 + 0x100 + lVar29);
                auVar65 = vfmadd231ps_fma(auVar65,auVar14,auVar86);
                fVar38 = *(float *)(uVar28 + 0x110 + lVar29);
                auVar64 = vfmadd231ps_fma(auVar64,(undefined1  [16])
                                                  tray.dir.field_0.field_0.x.field_0,auVar80);
                auVar78 = vfmadd231ps_fma(auVar78,(undefined1  [16])
                                                  tray.dir.field_0.field_0.x.field_0,auVar73);
                auVar82 = vfmadd231ps_fma(auVar82,auVar68,
                                          (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
                auVar13._4_4_ = tray.org.field_0._4_4_;
                auVar13._0_4_ = tray.org.field_0._0_4_;
                auVar13._8_4_ = tray.org.field_0._8_4_;
                auVar13._12_4_ = tray.org.field_0._12_4_;
                auVar88 = vfmadd231ps_fma(auVar47,auVar13,auVar80);
                fVar77 = *(float *)(uVar28 + 0x120 + lVar29);
                auVar92 = vfmadd231ps_fma(auVar40,auVar13,auVar73);
                fVar1 = *(float *)(uVar28 + 0x130 + lVar29);
                auVar93 = vfmadd231ps_fma(auVar65,auVar13,auVar68);
                fVar2 = *(float *)(uVar28 + 0x140 + lVar29);
                auVar47 = *(undefined1 (*) [16])(ray + 0x70);
                fVar6 = auVar47._0_4_;
                auVar95._0_4_ = fVar34 * fVar6;
                fVar7 = auVar47._4_4_;
                auVar95._4_4_ = fVar34 * fVar7;
                fVar8 = auVar47._8_4_;
                auVar95._8_4_ = fVar34 * fVar8;
                fVar9 = auVar47._12_4_;
                auVar95._12_4_ = fVar34 * fVar9;
                auVar74._0_4_ = fVar37 * fVar6;
                auVar74._4_4_ = fVar37 * fVar7;
                auVar74._8_4_ = fVar37 * fVar8;
                auVar74._12_4_ = fVar37 * fVar9;
                auVar69._0_4_ = fVar38 * fVar6;
                auVar69._4_4_ = fVar38 * fVar7;
                auVar69._8_4_ = fVar38 * fVar8;
                auVar69._12_4_ = fVar38 * fVar9;
                auVar45._8_4_ = 0x3f800000;
                auVar45._0_8_ = 0x3f8000003f800000;
                auVar45._12_4_ = 0x3f800000;
                auVar47 = vsubps_avx(auVar45,auVar47);
                auVar40 = ZEXT816(0) << 0x40;
                auVar97 = vfmadd231ps_fma(auVar95,auVar47,auVar40);
                auVar98 = vfmadd231ps_fma(auVar74,auVar47,auVar40);
                auVar101 = vfmadd231ps_fma(auVar69,auVar47,auVar40);
                fVar34 = auVar47._0_4_;
                auVar81._0_4_ = fVar34 + fVar77 * fVar6;
                fVar37 = auVar47._4_4_;
                auVar81._4_4_ = fVar37 + fVar77 * fVar7;
                fVar38 = auVar47._8_4_;
                auVar81._8_4_ = fVar38 + fVar77 * fVar8;
                fVar39 = auVar47._12_4_;
                auVar81._12_4_ = fVar39 + fVar77 * fVar9;
                auVar87._0_4_ = fVar1 * fVar6 + fVar34;
                auVar87._4_4_ = fVar1 * fVar7 + fVar37;
                auVar87._8_4_ = fVar1 * fVar8 + fVar38;
                auVar87._12_4_ = fVar1 * fVar9 + fVar39;
                local_1958._4_4_ = fVar2 * fVar7 + fVar37;
                local_1958._0_4_ = fVar2 * fVar6 + fVar34;
                fStack_1950 = fVar2 * fVar8 + fVar38;
                fStack_194c = fVar2 * fVar9 + fVar39;
                auVar47 = vandps_avx(auVar64,auVar83);
                auVar41._8_4_ = 0x219392ef;
                auVar41._0_8_ = 0x219392ef219392ef;
                auVar41._12_4_ = 0x219392ef;
                auVar47 = vcmpps_avx(auVar47,auVar41,1);
                auVar40 = vblendvps_avx(auVar64,auVar41,auVar47);
                auVar47 = vandps_avx(auVar78,auVar83);
                auVar47 = vcmpps_avx(auVar47,auVar41,1);
                auVar65 = vblendvps_avx(auVar78,auVar41,auVar47);
                auVar47 = vandps_avx(auVar82,auVar83);
                auVar107 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar47 = vcmpps_avx(auVar47,auVar41,1);
                auVar47 = vblendvps_avx(auVar82,auVar41,auVar47);
                auVar43 = ZEXT1664(auVar43._0_16_);
                auVar64 = vrcpps_avx(auVar40);
                auVar40 = vfnmadd213ps_fma(auVar40,auVar64,auVar45);
                auVar64 = vfmadd132ps_fma(auVar40,auVar64,auVar64);
                auVar40 = vrcpps_avx(auVar65);
                auVar65 = vfnmadd213ps_fma(auVar65,auVar40,auVar45);
                auVar65 = vfmadd132ps_fma(auVar65,auVar40,auVar40);
                auVar40 = vrcpps_avx(auVar47);
                auVar47 = vfnmadd213ps_fma(auVar47,auVar40,auVar45);
                auVar78 = vfmadd132ps_fma(auVar47,auVar40,auVar40);
                auVar47 = vsubps_avx(auVar97,auVar88);
                auVar40 = vsubps_avx(auVar81,auVar88);
                auVar96._0_4_ = auVar47._0_4_ * auVar64._0_4_;
                auVar96._4_4_ = auVar47._4_4_ * auVar64._4_4_;
                auVar96._8_4_ = auVar47._8_4_ * auVar64._8_4_;
                auVar96._12_4_ = auVar47._12_4_ * auVar64._12_4_;
                auVar36._0_4_ = auVar64._0_4_ * auVar40._0_4_;
                auVar36._4_4_ = auVar64._4_4_ * auVar40._4_4_;
                auVar36._8_4_ = auVar64._8_4_ * auVar40._8_4_;
                auVar36._12_4_ = auVar64._12_4_ * auVar40._12_4_;
                auVar47 = vsubps_avx(auVar98,auVar92);
                auVar40 = vsubps_avx(auVar87,auVar92);
                auVar75._0_4_ = auVar65._0_4_ * auVar47._0_4_;
                auVar75._4_4_ = auVar65._4_4_ * auVar47._4_4_;
                auVar75._8_4_ = auVar65._8_4_ * auVar47._8_4_;
                auVar75._12_4_ = auVar65._12_4_ * auVar47._12_4_;
                auVar54._0_4_ = auVar65._0_4_ * auVar40._0_4_;
                auVar54._4_4_ = auVar65._4_4_ * auVar40._4_4_;
                auVar54._8_4_ = auVar65._8_4_ * auVar40._8_4_;
                auVar54._12_4_ = auVar65._12_4_ * auVar40._12_4_;
                auVar47 = vsubps_avx(auVar101,auVar93);
                auVar70._0_4_ = auVar78._0_4_ * auVar47._0_4_;
                auVar70._4_4_ = auVar78._4_4_ * auVar47._4_4_;
                auVar70._8_4_ = auVar78._8_4_ * auVar47._8_4_;
                auVar70._12_4_ = auVar78._12_4_ * auVar47._12_4_;
                auVar47 = vsubps_avx(_local_1958,auVar93);
                auVar46._0_4_ = auVar78._0_4_ * auVar47._0_4_;
                auVar46._4_4_ = auVar78._4_4_ * auVar47._4_4_;
                auVar46._8_4_ = auVar78._8_4_ * auVar47._8_4_;
                auVar46._12_4_ = auVar78._12_4_ * auVar47._12_4_;
                auVar47 = vpminsd_avx(auVar96,auVar36);
                auVar40 = vpminsd_avx(auVar75,auVar54);
                auVar47 = vpmaxsd_avx(auVar47,auVar40);
                auVar40 = vpminsd_avx(auVar70,auVar46);
                auVar40 = vpmaxsd_avx(auVar47,auVar40);
                auVar47 = vpmaxsd_avx(auVar96,auVar36);
                auVar65 = vpmaxsd_avx(auVar75,auVar54);
                auVar64 = vpminsd_avx(auVar47,auVar65);
                auVar47 = vpmaxsd_avx(auVar70,auVar46);
                auVar65 = vpmaxsd_avx(auVar40,(undefined1  [16])tray.tnear.field_0);
                auVar47 = vpminsd_avx(auVar64,auVar47);
                auVar47 = vpminsd_avx(auVar47,(undefined1  [16])tray.tfar.field_0);
                auVar47 = vcmpps_avx(auVar65,auVar47,2);
              }
              auVar47 = vandps_avx(auVar47,auVar43._0_16_);
              auVar47 = vpslld_avx(auVar47,0x1f);
              if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar47 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar47 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar47[0xf]) {
                auVar50 = ZEXT1664(auVar48);
                root.ptr = sVar30;
              }
              else {
                auVar47 = vblendvps_avx(auVar107._0_16_,auVar40,auVar47);
                auVar50 = ZEXT1664(auVar47);
                if (sVar30 != 8) {
                  pNVar33->ptr = sVar30;
                  pNVar33 = pNVar33 + 1;
                  local_1968 = auVar48._0_8_;
                  uStack_1960 = auVar48._8_8_;
                  *(undefined8 *)paVar32 = local_1968;
                  *(undefined8 *)(paVar32->v + 2) = uStack_1960;
                  paVar32 = paVar32 + 1;
                }
              }
              auVar48 = auVar50._0_16_;
              lVar29 = lVar29 + 4;
              sVar30 = root.ptr;
            } while (lVar29 != 0);
            if (root.ptr == 8) goto LAB_004e6a24;
            auVar48 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar50._0_16_,6);
            uVar25 = vmovmskps_avx(auVar48);
          } while ((byte)uVar27 < (byte)POPCOUNT(uVar25));
          pNVar33->ptr = root.ptr;
          pNVar33 = pNVar33 + 1;
          *paVar32 = auVar50._0_16_;
          paVar32 = paVar32 + 1;
        }
        else {
          do {
            sVar30 = 0;
            for (uVar31 = uVar28; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
              sVar30 = sVar30 + 1;
            }
            bVar23 = occluded1(This,bvh,root,sVar30,&pre,ray,&tray,context);
            if (bVar23) {
              terminated.field_0.i[sVar30] = -1;
            }
            uVar28 = uVar28 - 1 & uVar28;
          } while (uVar28 != 0);
          auVar48 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
          iVar26 = 3;
          if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar48[0xf] < '\0') {
            auVar48._8_4_ = 0xff800000;
            auVar48._0_8_ = 0xff800000ff800000;
            auVar48._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar48,
                               (undefined1  [16])terminated.field_0);
            iVar26 = 2;
          }
          auVar107 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar50 = ZEXT1664((undefined1  [16])vVar3.field_0);
          if (uVar27 < uVar24) goto LAB_004e654e;
        }
LAB_004e6a24:
      } while (iVar26 != 3);
LAB_004e6c07:
      auVar48 = vandps_avx(auVar42,(undefined1  [16])terminated.field_0);
      auVar42._8_4_ = 0xff800000;
      auVar42._0_8_ = 0xff800000ff800000;
      auVar42._12_4_ = 0xff800000;
      auVar48 = vmaskmovps_avx(auVar48,auVar42);
      *(undefined1 (*) [16])(ray + 0x80) = auVar48;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }